

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStringLenDecodeEntities(void)

{
  xmlChar val;
  xmlChar val_00;
  xmlChar val_01;
  int iVar1;
  int iVar2;
  int iVar3;
  xmlParserCtxtPtr val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  int local_5c;
  int n_end3;
  xmlChar end3;
  int n_end2;
  xmlChar end2;
  int n_end;
  xmlChar end;
  int n_what;
  int what;
  int n_len;
  int len;
  int n_str;
  xmlChar *str;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (str._4_4_ = 0; (int)str._4_4_ < 3; str._4_4_ = str._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (n_what = 0; n_what < 4; n_what = n_what + 1) {
        for (n_end = 0; n_end < 4; n_end = n_end + 1) {
          for (n_end2 = 0; n_end2 < 4; n_end2 = n_end2 + 1) {
            for (n_end3 = 0; n_end3 < 4; n_end3 = n_end3 + 1) {
              for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
                iVar1 = xmlMemBlocks();
                val_02 = gen_xmlParserCtxtPtr(str._4_4_,0);
                val_03 = gen_const_xmlChar_ptr(n_len,1);
                what = gen_int(n_what,2);
                iVar2 = gen_int(n_end,3);
                val = gen_xmlChar(n_end2,4);
                val_00 = gen_xmlChar(n_end3,5);
                val_01 = gen_xmlChar(local_5c,6);
                if (val_03 != (xmlChar *)0x0) {
                  iVar3 = xmlStrlen(val_03);
                  if (iVar3 < what) {
                    what = 0;
                  }
                }
                val_04 = (xmlChar *)
                         xmlStringLenDecodeEntities(val_02,val_03,what,iVar2,val,val_00,val_01);
                desret_xmlChar_ptr(val_04);
                call_tests = call_tests + 1;
                des_xmlParserCtxtPtr(str._4_4_,val_02,0);
                des_const_xmlChar_ptr(n_len,val_03,1);
                des_int(n_what,what,2);
                des_int(n_end,iVar2,3);
                des_xmlChar(n_end2,val,4);
                des_xmlChar(n_end3,val_00,5);
                des_xmlChar(local_5c,val_01,6);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                         (ulong)(uint)(iVar2 - iVar1));
                  ret_val._4_4_ = ret_val._4_4_ + 1;
                  printf(" %d",(ulong)str._4_4_);
                  printf(" %d",(ulong)(uint)n_len);
                  printf(" %d",(ulong)(uint)n_what);
                  printf(" %d",(ulong)(uint)n_end);
                  printf(" %d",(ulong)(uint)n_end2);
                  printf(" %d",(ulong)(uint)n_end3);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlStringLenDecodeEntities(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    xmlParserCtxtPtr ctxt; /* the parser context */
    int n_ctxt;
    const xmlChar * str; /* the input string */
    int n_str;
    int len; /* the string length */
    int n_len;
    int what; /* combination of XML_SUBSTITUTE_REF and XML_SUBSTITUTE_PEREF */
    int n_what;
    xmlChar end; /* an end marker xmlChar, 0 if none */
    int n_end;
    xmlChar end2; /* an end marker xmlChar, 0 if none */
    int n_end2;
    xmlChar end3; /* an end marker xmlChar, 0 if none */
    int n_end3;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
    for (n_what = 0;n_what < gen_nb_int;n_what++) {
    for (n_end = 0;n_end < gen_nb_xmlChar;n_end++) {
    for (n_end2 = 0;n_end2 < gen_nb_xmlChar;n_end2++) {
    for (n_end3 = 0;n_end3 < gen_nb_xmlChar;n_end3++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        str = gen_const_xmlChar_ptr(n_str, 1);
        len = gen_int(n_len, 2);
        what = gen_int(n_what, 3);
        end = gen_xmlChar(n_end, 4);
        end2 = gen_xmlChar(n_end2, 5);
        end3 = gen_xmlChar(n_end3, 6);
        if ((str != NULL) &&
            (len > xmlStrlen(BAD_CAST str)))
            len = 0;

        ret_val = xmlStringLenDecodeEntities(ctxt, str, len, what, end, end2, end3);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_str, str, 1);
        des_int(n_len, len, 2);
        des_int(n_what, what, 3);
        des_xmlChar(n_end, end, 4);
        des_xmlChar(n_end2, end2, 5);
        des_xmlChar(n_end3, end3, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_str);
            printf(" %d", n_len);
            printf(" %d", n_what);
            printf(" %d", n_end);
            printf(" %d", n_end2);
            printf(" %d", n_end3);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}